

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::addAlias(CommonCore *this,string_view interfaceKey,string_view alias)

{
  ActionMessage addAlias;
  ActionMessage AStack_e8;
  
  ActionMessage::ActionMessage(&AStack_e8,cmd_add_alias);
  ActionMessage::name(&AStack_e8,interfaceKey);
  ActionMessage::setStringData(&AStack_e8,alias);
  BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_e8);
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CommonCore::addAlias(std::string_view interfaceKey, std::string_view alias)
{
    ActionMessage addAlias(CMD_ADD_ALIAS);
    addAlias.name(interfaceKey);
    addAlias.setStringData(alias);
    addActionMessage(std::move(addAlias));
}